

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::remap_ext_framebuffer_fetch
          (CompilerGLSL *this,uint32_t input_attachment_index,uint32_t color_location,bool coherent)

{
  pair<unsigned_int,_bool> local_2c;
  pair<unsigned_int,_unsigned_int> local_24;
  bool local_19;
  uint32_t local_18;
  uint32_t uStack_14;
  bool coherent_local;
  uint32_t color_location_local;
  uint32_t input_attachment_index_local;
  CompilerGLSL *this_local;
  
  local_19 = coherent;
  local_18 = color_location;
  uStack_14 = input_attachment_index;
  _color_location_local = this;
  ::std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int_&,_unsigned_int_&,_true>
            (&local_24,&stack0xffffffffffffffec,&local_18);
  ::std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::push_back(&this->subpass_to_framebuffer_fetch_attachment,&local_24);
  ::std::pair<unsigned_int,_bool>::pair<unsigned_int_&,_bool_&,_true>(&local_2c,&local_18,&local_19)
  ;
  ::std::vector<std::pair<unsigned_int,_bool>,_std::allocator<std::pair<unsigned_int,_bool>_>_>::
  push_back(&this->inout_color_attachments,&local_2c);
  return;
}

Assistant:

void CompilerGLSL::remap_ext_framebuffer_fetch(uint32_t input_attachment_index, uint32_t color_location, bool coherent)
{
	subpass_to_framebuffer_fetch_attachment.push_back({ input_attachment_index, color_location });
	inout_color_attachments.push_back({ color_location, coherent });
}